

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O3

void __thiscall
APITests::_test_events
          (APITests *this,int init,Edge edge,
          vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *tests,
          bool specify_callback,bool use_add_callback)

{
  bool bVar1;
  uint uVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  pointer ppVar6;
  uint uVar7;
  _Any_data *p_Var8;
  undefined3 in_register_00000089;
  byte bVar9;
  uint __len;
  uint __val;
  char *__end;
  bool event_callback_occurred;
  string __str;
  TestCallback callback;
  bool local_121;
  APITests *local_120;
  Edge local_114;
  pointer local_110;
  _Any_data local_108;
  _Manager_type local_f8;
  undefined8 uStack_f0;
  code *local_e8 [2];
  code *local_d8;
  code *local_d0;
  undefined1 local_c0 [8];
  _Alloc_hider local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  string local_98;
  string local_78;
  vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *local_58;
  string local_50;
  
  local_110 = (pointer)CONCAT44(local_110._4_4_,CONCAT31(in_register_00000089,use_add_callback));
  local_121 = false;
  local_114 = edge;
  local_58 = tests;
  GPIO::setmode(BOARD);
  __len = 1;
  GPIO::setup((this->pin_data).out_a,OUT,init);
  GPIO::setup((this->pin_data).in_a,IN,-1);
  uVar7 = (this->pin_data).in_a;
  __val = -uVar7;
  if (0 < (int)uVar7) {
    __val = uVar7;
  }
  if (9 < __val) {
    uVar5 = (ulong)__val;
    uVar2 = 4;
    do {
      __len = uVar2;
      uVar4 = (uint)uVar5;
      if (uVar4 < 100) {
        __len = __len - 2;
        goto LAB_00114267;
      }
      if (uVar4 < 1000) {
        __len = __len - 1;
        goto LAB_00114267;
      }
      if (uVar4 < 10000) goto LAB_00114267;
      uVar5 = uVar5 / 10000;
      uVar2 = __len + 4;
    } while (99999 < uVar4);
    __len = __len + 1;
  }
LAB_00114267:
  local_120 = this;
  local_108._M_unused._M_object = &local_f8;
  std::__cxx11::string::_M_construct((ulong)&local_108,(char)__len - (char)((int)uVar7 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)local_108._M_unused._0_8_ + (ulong)(uVar7 >> 0x1f)),__len,__val);
  local_c0 = (undefined1  [8])&local_121;
  local_b8._M_p = (pointer)&local_a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,local_108._M_unused._M_object,
             local_108._8_8_ + (long)local_108._M_unused._0_8_);
  ppVar6 = local_110;
  if ((_Manager_type *)local_108._M_unused._0_8_ != &local_f8) {
    operator_delete(local_108._M_unused._M_object,(ulong)(local_f8 + 1));
  }
  uVar7 = (local_120->pin_data).in_a;
  if (specify_callback) {
    std::function<void(std::__cxx11::string_const&)>::function<TestCallback&,void>
              ((function<void(std::__cxx11::string_const&)> *)local_108._M_pod_data,
               (TestCallback *)local_c0);
    local_e8[1] = (code *)0x0;
    local_e8[0] = GPIO::details::
                  CallbackCompare<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  ::Compare<TestCallback>;
    local_d0 = std::
               _Function_handler<bool_(const_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&,_const_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&),_bool_(*)(const_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&,_const_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&)>
               ::_M_invoke;
    local_d8 = std::
               _Function_handler<bool_(const_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&,_const_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&),_bool_(*)(const_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&,_const_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&)>
               ::_M_manager;
    GPIO::add_event_detect(uVar7,local_114,(Callback *)&local_108,0);
    if (local_d8 != (code *)0x0) {
      p_Var8 = (_Any_data *)local_e8;
      (*local_d8)(p_Var8,p_Var8,__destroy_functor);
      uVar7 = (uint)p_Var8;
    }
    if (local_f8 != (_Manager_type)0x0) {
      p_Var8 = &local_108;
      (*local_f8)(p_Var8,p_Var8,__destroy_functor);
      uVar7 = (uint)p_Var8;
    }
  }
  else {
    local_f8 = (_Manager_type)0x0;
    uStack_f0 = 0;
    local_108._M_unused._M_object = (_Manager_type *)0x0;
    local_108._8_8_ = 0;
    local_e8[1] = (code *)0x0;
    local_e8[0] = GPIO::details::CallbackCompare<void(std::__cxx11::string_const&)>::
                  Compare<decltype(nullptr)>;
    local_d0 = std::
               _Function_handler<bool_(const_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&,_const_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&),_bool_(*)(const_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&,_const_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&)>
               ::_M_invoke;
    local_d8 = std::
               _Function_handler<bool_(const_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&,_const_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&),_bool_(*)(const_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&,_const_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&)>
               ::_M_manager;
    GPIO::add_event_detect(uVar7,local_114,(Callback *)&local_108,0);
    if (local_d8 != (code *)0x0) {
      p_Var8 = (_Any_data *)local_e8;
      (*local_d8)(p_Var8,p_Var8,__destroy_functor);
      uVar7 = (uint)p_Var8;
    }
    if (local_f8 != (_Manager_type)0x0) {
      p_Var8 = &local_108;
      (*local_f8)(p_Var8,p_Var8,__destroy_functor);
      uVar7 = (uint)p_Var8;
    }
  }
  if ((byte)ppVar6 != 0) {
    uVar7 = (local_120->pin_data).in_a;
    std::function<void(std::__cxx11::string_const&)>::function<TestCallback&,void>
              ((function<void(std::__cxx11::string_const&)> *)local_108._M_pod_data,
               (TestCallback *)local_c0);
    local_e8[1] = (code *)0x0;
    local_e8[0] = GPIO::details::
                  CallbackCompare<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  ::Compare<TestCallback>;
    local_d0 = std::
               _Function_handler<bool_(const_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&,_const_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&),_bool_(*)(const_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&,_const_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&)>
               ::_M_invoke;
    local_d8 = std::
               _Function_handler<bool_(const_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&,_const_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&),_bool_(*)(const_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&,_const_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&)>
               ::_M_manager;
    GPIO::add_event_callback(uVar7,(Callback *)&local_108);
    if (local_d8 != (code *)0x0) {
      p_Var8 = (_Any_data *)local_e8;
      (*local_d8)(p_Var8,p_Var8,__destroy_functor);
      uVar7 = (uint)p_Var8;
    }
    if (local_f8 != (_Manager_type)0x0) {
      p_Var8 = &local_108;
      (*local_f8)(p_Var8,p_Var8,__destroy_functor);
      uVar7 = (uint)p_Var8;
    }
  }
  sleep(uVar7);
  bVar3 = local_121;
  bVar9 = specify_callback | (byte)ppVar6;
  if (bVar9 == 1) {
    local_121 = false;
  }
  else {
    bVar3 = GPIO::event_detected((local_120->pin_data).in_a);
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  assert::is_true((bool)(bVar3 ^ 1),&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  ppVar6 = (local_58->
           super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>)._M_impl
           .super__Vector_impl_data._M_start;
  local_110 = (local_58->
              super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>).
              _M_impl.super__Vector_impl_data._M_finish;
  if (ppVar6 != local_110) {
    do {
      uVar7 = (local_120->pin_data).out_a;
      GPIO::output(uVar7,ppVar6->first);
      sleep(uVar7);
      bVar3 = local_121;
      if (bVar9 == 0) {
        bVar3 = GPIO::event_detected((local_120->pin_data).in_a);
      }
      else {
        local_121 = false;
      }
      bVar1 = ppVar6->second;
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"","");
      assert::is_true(bVar1 == (bool)bVar3,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      bVar3 = local_121;
      if (bVar9 == 0) {
        bVar3 = GPIO::event_detected((local_120->pin_data).in_a);
      }
      else {
        local_121 = false;
      }
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"","");
      assert::is_true((bool)(bVar3 ^ 1),&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      ppVar6 = ppVar6 + 1;
    } while (ppVar6 != local_110);
  }
  GPIO::remove_event_detect((local_120->pin_data).in_a);
  GPIO::cleanup();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_p != &local_a8) {
    operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void _test_events(int init, GPIO::Edge edge, const std::vector<std::pair<int, bool>>& tests, bool specify_callback,
                      bool use_add_callback)
    {
        bool event_callback_occurred = false;

        GPIO::setmode(GPIO::BOARD);
        GPIO::setup(pin_data.out_a, GPIO::OUT, init);
        GPIO::setup(pin_data.in_a, GPIO::IN);

        TestCallback callback(&event_callback_occurred, std::to_string(pin_data.in_a));

        auto get_saw_event = [&]() mutable -> bool
        {
            if (specify_callback || use_add_callback)
            {
                bool val = event_callback_occurred;
                event_callback_occurred = false;
                return val;
            }

            return GPIO::event_detected(pin_data.in_a);
        };

        if (specify_callback)
            GPIO::add_event_detect(pin_data.in_a, edge, callback);
        else
            GPIO::add_event_detect(pin_data.in_a, edge);

        if (use_add_callback)
            GPIO::add_event_callback(pin_data.in_a, callback);

        sleep(0.1);
        assert::is_true(!get_saw_event());

        for (auto& pair : tests)
        {
            auto& output = pair.first;
            auto& event_expected = pair.second;

            GPIO::output(pin_data.out_a, output);
            sleep(0.1);
            assert::is_true(get_saw_event() == event_expected);
            assert::is_true(!get_saw_event());
        }

        GPIO::remove_event_detect(pin_data.in_a);
        GPIO::cleanup();
    }